

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerWrapClampToBorderCase::test
          (SamplerWrapClampToBorderCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  ResultCollector *pRVar1;
  deBool dVar2;
  Enum<int,_2UL> EVar3;
  GetNameFunc local_290;
  int local_288;
  string local_280;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  GLenum local_1d4;
  GetNameFunc p_Stack_1d0;
  deUint32 err_2;
  int local_1c8;
  GetNameFunc local_1c0;
  int local_1b8;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  GLenum local_104;
  GetNameFunc p_Stack_100;
  deUint32 err_1;
  int local_f8;
  GetNameFunc local_f0;
  int local_e8;
  string local_e0;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLenum local_24;
  ResultCollector *pRStack_20;
  deUint32 err;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerWrapClampToBorderCase *this_local;
  
  pRStack_20 = result;
  result_local = (ResultCollector *)gl;
  gl_local = (CallLogWrapper *)this;
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x812d);
  do {
    local_24 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = pRStack_20;
    if (local_24 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Got Error ",&local_a9)
      ;
      EVar3 = glu::getErrorStr(local_24);
      p_Stack_100 = EVar3.m_getName;
      local_f8 = EVar3.m_value;
      local_f0 = p_Stack_100;
      local_e8 = local_f8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_e0,&local_f0);
      std::operator+(&local_88,&local_a8,&local_e0);
      std::operator+(&local_68,&local_88,": ");
      std::operator+(&local_48,&local_68,"glSamplerParameteri");
      tcu::ResultCollector::fail(pRVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (pRStack_20,(CallLogWrapper *)result_local,(this->super_SamplerTest).m_target,
             (this->super_SamplerTest).m_pname,0x812d,(this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameteri
            ((CallLogWrapper *)result_local,(this->super_SamplerTest).m_target,
             (this->super_SamplerTest).m_pname,0x2901);
  do {
    local_104 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = pRStack_20;
    if (local_104 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Got Error ",&local_189);
      EVar3 = glu::getErrorStr(local_104);
      p_Stack_1d0 = EVar3.m_getName;
      local_1c8 = EVar3.m_value;
      local_1c0 = p_Stack_1d0;
      local_1b8 = local_1c8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b0,&local_1c0);
      std::operator+(&local_168,&local_188,&local_1b0);
      std::operator+(&local_148,&local_168,": ");
      std::operator+(&local_128,&local_148,"glSamplerParameteri");
      tcu::ResultCollector::fail(pRVar1,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator(&local_189);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  glu::CallLogWrapper::glSamplerParameterf
            ((CallLogWrapper *)result_local,(this->super_SamplerTest).m_target,
             (this->super_SamplerTest).m_pname,33069.0);
  do {
    local_1d4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)result_local);
    pRVar1 = pRStack_20;
    if (local_1d4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"Got Error ",&local_259);
      EVar3 = glu::getErrorStr(local_1d4);
      local_290 = EVar3.m_getName;
      local_288 = EVar3.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_280,&local_290);
      std::operator+(&local_238,&local_258,&local_280);
      std::operator+(&local_218,&local_238,": ");
      std::operator+(&local_1f8,&local_218,"glSamplerParameterf");
      tcu::ResultCollector::fail(pRVar1,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (pRStack_20,(CallLogWrapper *)result_local,(this->super_SamplerTest).m_target,
             (this->super_SamplerTest).m_pname,0x812d,(this->super_SamplerTest).m_type);
  return;
}

Assistant:

void SamplerWrapClampToBorderCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	gl.glSamplerParameteri(m_target, m_pname, GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");
	verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);

	gl.glSamplerParameteri(m_target, m_pname, GL_REPEAT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

	gl.glSamplerParameterf(m_target, m_pname, (GLfloat)GL_CLAMP_TO_BORDER_EXT);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

	verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_CLAMP_TO_BORDER_EXT, m_type);
}